

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

size_t testing::internal::GetThreadCount(void)

{
  __pid_t _Var1;
  ostream *this;
  size_t sVar2;
  int iVar3;
  int local_264;
  string filename;
  string dummy;
  ifstream file;
  
  Message::Message((Message *)&file);
  this = (ostream *)(_file + 0x10);
  std::operator<<(this,"/proc/");
  _Var1 = getpid();
  std::ostream::operator<<(this,_Var1);
  std::operator<<((ostream *)(_file + 0x10),"/stat");
  StringStreamToString((string *)&filename,_file);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&file);
  dummy._M_dataplus._M_p = (pointer)&dummy.field_2;
  dummy._M_string_length = 0;
  dummy.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&file,filename._M_dataplus._M_p,_S_in);
  iVar3 = -0x14;
  while (iVar3 = iVar3 + 1, iVar3 != 0) {
    std::operator>>((istream *)&file,(string *)&dummy);
  }
  local_264 = 0;
  std::istream::operator>>((istream *)&file,&local_264);
  sVar2 = (size_t)local_264;
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&dummy);
  std::__cxx11::string::~string((string *)&filename);
  return sVar2;
}

Assistant:

size_t GetThreadCount() {
  const string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}